

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall
xemmai::t_type_of<xemmai::t_object>::t_type_of<1ul>
          (t_type_of<xemmai::t_object> *this,array<const_void_*,_1UL> *a_ids,t_type *a_super,
          t_object *a_module,size_t a_native,size_t a_instance_fields,
          vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
          *a_fields,
          map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          *a_key2index)

{
  t_object *ptVar1;
  const_pointer ppvVar2;
  size_t sVar3;
  size_type sVar4;
  const_iterator __first;
  const_iterator __last;
  pair<xemmai::t_slot,_xemmai::t_value<xemmai::t_slot>_> *__result;
  const_iterator __first_00;
  const_iterator __last_00;
  pair<xemmai::t_object_*,_unsigned_long> *__result_00;
  size_t a_instance_fields_local;
  size_t a_native_local;
  t_object *a_module_local;
  t_type *a_super_local;
  array<const_void_*,_1UL> *a_ids_local;
  t_type_of<xemmai::t_object> *this_local;
  
  ptVar1 = t_object::f_of(this);
  t_slot::t_slot(&this->v_this,ptVar1);
  this->v_depth = 0;
  ppvVar2 = std::array<const_void_*,_1UL>::data(a_ids);
  this->v_ids = ppvVar2;
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::t_slot_of(&this->v_super);
  t_slot::t_slot(&this->v_module,a_module);
  sVar3 = t_object::f_fields_offset(a_native);
  this->v_fields_offset = sVar3;
  this->v_instance_fields = a_instance_fields;
  sVar4 = std::
          vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
          ::size(a_fields);
  this->v_fields = sVar4;
  this->v_builtin = false;
  this->v_revive = false;
  this->v_bindable = false;
  *(undefined8 *)&this->field_0x58 = 0;
  this->v_derive = 0;
  this->f_scan = f_do_scan;
  this->f_finalize = (_func_void_t_object_ptr_t_scan *)0x0;
  this->v_construct = (offset_in_t_type_to_subr)f_do_construct;
  *(undefined8 *)&this->field_0x78 = 0;
  this->v_instantiate = (offset_in_t_type_to_subr)f_do_instantiate;
  *(undefined8 *)&this->field_0x88 = 0;
  this->v_get = (offset_in_t_type_to_subr)f_do_get;
  *(undefined8 *)&this->field_0x98 = 0;
  this->v_put = f_do_put;
  this->v_has = (offset_in_t_type_to_subr)f_do_has;
  *(undefined8 *)&this->field_0xb0 = 0;
  this->f_call = f_do_call;
  this->f_string = f_do_string;
  this->f_hash = f_do_hash;
  this->f_get_at = f_do_get_at;
  this->f_set_at = f_do_set_at;
  this->f_plus = f_do_plus;
  this->f_minus = f_do_minus;
  this->f_complement = f_do_complement;
  this->f_multiply = f_do_multiply;
  this->f_divide = f_do_divide;
  this->f_modulus = f_do_modulus;
  this->f_add = f_do_add;
  this->f_subtract = f_do_subtract;
  this->f_left_shift = f_do_left_shift;
  this->f_right_shift = f_do_right_shift;
  this->f_less = f_do_less;
  this->f_less_equal = f_do_less_equal;
  this->f_greater = f_do_greater;
  this->f_greater_equal = f_do_greater_equal;
  this->f_equals = f_do_equals;
  this->f_not_equals = f_do_not_equals;
  this->f_and = f_do_and;
  this->f_xor = f_do_xor;
  this->f_or = f_do_or;
  ptVar1 = t_object::f_of(a_super);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct(&this->v_super,ptVar1);
  __first = std::
            vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
            ::begin(a_fields);
  __last = std::
           vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           ::end(a_fields);
  __result = f_fields(this);
  std::
  uninitialized_copy<__gnu_cxx::__normal_iterator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>const*,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>>,std::pair<xemmai::t_slot,xemmai::t_value<xemmai::t_slot>>*>
            ((__normal_iterator<const_std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_*,_std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<const_std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_*,_std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>_>
              )__last._M_current,__result);
  __first_00 = std::
               map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
               ::begin(a_key2index);
  __last_00 = std::
              map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
              ::end(a_key2index);
  __result_00 = f_key2index(this);
  std::
  copy<std::_Rb_tree_const_iterator<std::pair<xemmai::t_object*const,unsigned_long>>,std::pair<xemmai::t_object*,unsigned_long>*>
            ((_Rb_tree_const_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>)
             __first_00._M_node,
             (_Rb_tree_const_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>)
             __last_00._M_node,__result_00);
  return;
}

Assistant:

inline t_type::t_type_of(const std::array<t_type_id, A_n>& a_ids, t_type* a_super, t_object* a_module, size_t a_native, size_t a_instance_fields, const std::vector<std::pair<t_root, t_rvalue>>& a_fields, const std::map<t_object*, size_t>& a_key2index) : v_this(t_object::f_of(this)), v_depth(A_n - 1), v_ids(a_ids.data()), v_module(a_module), v_fields_offset(t_object::f_fields_offset(a_native)), v_instance_fields(a_instance_fields), v_fields(a_fields.size())
{
	v_super.f_construct(t_object::f_of(a_super));
	std::uninitialized_copy(a_fields.begin(), a_fields.end(), f_fields());
	std::copy(a_key2index.begin(), a_key2index.end(), f_key2index());
}